

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_import.c
# Opt level: O1

REF_STATUS
ref_import_bin_ugrid
          (REF_GRID_conflict *ref_grid_ptr,REF_MPI ref_mpi,char *filename,REF_BOOL swap,REF_BOOL fat
          )

{
  REF_GRID_conflict pRVar1;
  REF_NODE ref_node;
  ulong uVar2;
  REF_DBL *pRVar3;
  uint uVar4;
  uint uVar5;
  int iVar6;
  FILE *__stream;
  void *__ptr;
  size_t sVar7;
  ulong uVar8;
  ulong uVar9;
  long lVar10;
  size_t __n;
  undefined8 uVar11;
  REF_GLOB global;
  char *pcVar12;
  REF_STATUS RVar13;
  long lVar14;
  REF_INT new_node;
  REF_INT nhex;
  REF_INT npri;
  REF_INT npyr;
  REF_INT ntet;
  REF_INT nqua;
  REF_INT ntri;
  REF_INT nnode;
  int local_78;
  REF_INT local_74;
  REF_INT local_70;
  REF_INT local_6c;
  REF_INT local_68;
  REF_INT local_64;
  REF_INT local_60;
  uint local_5c;
  ulong local_58;
  ulong local_50;
  void *local_48;
  size_t local_40;
  long local_38;
  
  uVar5 = ref_grid_create(ref_grid_ptr,ref_mpi);
  if (uVar5 != 0) {
    printf("%s: %d: %s: %d %s\n",
           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_import.c",0x22d,
           "ref_import_bin_ugrid",(ulong)uVar5,"create grid");
    return uVar5;
  }
  pRVar1 = *ref_grid_ptr;
  ref_node = pRVar1->node;
  __stream = fopen(filename,"r");
  if (__stream == (FILE *)0x0) {
    printf("unable to open %s\n",filename);
    pcVar12 = "unable to open file";
    uVar11 = 0x233;
  }
  else {
    uVar5 = ref_import_bin_ugrid_chunk((FILE *)__stream,swap,fat,1,(REF_INT *)&local_5c);
    if (uVar5 != 0) {
      printf("%s: %d: %s: %d %s\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_import.c",
             0x235,"ref_import_bin_ugrid",(ulong)uVar5,"nnode");
      return uVar5;
    }
    uVar5 = ref_import_bin_ugrid_chunk((FILE *)__stream,swap,fat,1,&local_60);
    if (uVar5 != 0) {
      printf("%s: %d: %s: %d %s\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_import.c",
             0x236,"ref_import_bin_ugrid",(ulong)uVar5,"ntri");
      return uVar5;
    }
    uVar5 = ref_import_bin_ugrid_chunk((FILE *)__stream,swap,fat,1,&local_64);
    if (uVar5 != 0) {
      printf("%s: %d: %s: %d %s\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_import.c",
             0x237,"ref_import_bin_ugrid",(ulong)uVar5,"nqua");
      return uVar5;
    }
    uVar5 = ref_import_bin_ugrid_chunk((FILE *)__stream,swap,fat,1,&local_68);
    if (uVar5 != 0) {
      printf("%s: %d: %s: %d %s\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_import.c",
             0x238,"ref_import_bin_ugrid",(ulong)uVar5,"ntet");
      return uVar5;
    }
    uVar5 = ref_import_bin_ugrid_chunk((FILE *)__stream,swap,fat,1,&local_6c);
    if (uVar5 != 0) {
      printf("%s: %d: %s: %d %s\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_import.c",
             0x239,"ref_import_bin_ugrid",(ulong)uVar5,"npyr");
      return uVar5;
    }
    uVar5 = ref_import_bin_ugrid_chunk((FILE *)__stream,swap,fat,1,&local_70);
    if (uVar5 != 0) {
      printf("%s: %d: %s: %d %s\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_import.c",
             0x23a,"ref_import_bin_ugrid",(ulong)uVar5,"npri");
      return uVar5;
    }
    uVar5 = ref_import_bin_ugrid_chunk((FILE *)__stream,swap,fat,1,&local_74);
    if (uVar5 != 0) {
      printf("%s: %d: %s: %d %s\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_import.c",
             0x23b,"ref_import_bin_ugrid",(ulong)uVar5,"nhex");
      return uVar5;
    }
    if (0 < ref_mpi->timing) {
      ref_mpi_stopwatch_stop(ref_mpi,"ugrid header");
    }
    lVar14 = (long)(int)local_5c;
    local_58 = 1000000;
    if ((int)local_5c < 1000000) {
      local_58 = (ulong)local_5c;
    }
    if (lVar14 < 0) {
      printf("%s: %d: %s: %s\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_import.c",
             0x241,"ref_import_bin_ugrid","malloc xyz of REF_DBL negative");
      return 1;
    }
    __ptr = malloc((ulong)(uint)((int)local_58 * 0x18));
    if (__ptr != (void *)0x0) {
      if (local_5c != 0) {
        iVar6 = 0;
        RVar13 = 0;
        local_48 = __ptr;
        local_38 = lVar14;
        do {
          uVar5 = (int)local_38 - iVar6;
          local_50 = (ulong)uVar5;
          if ((int)local_58 < (int)uVar5) {
            local_50 = local_58 & 0xffffffff;
          }
          uVar4 = (int)local_50 * 3;
          uVar9 = (ulong)uVar4;
          __n = (size_t)(int)uVar4;
          sVar7 = fread(local_48,8,__n,__stream);
          if (sVar7 != __n) {
            local_40 = sVar7;
            printf("%s: %d: %s: %s\nexpected %ld was %ld\n",
                   "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_import.c"
                   ,0x246,"ref_import_bin_ugrid","xyz",__n,sVar7);
            RVar13 = 1;
            sVar7 = local_40;
          }
          if (sVar7 != __n) {
            return RVar13;
          }
          if ((swap != 0) && (0 < (int)uVar5)) {
            if ((int)uVar4 < 2) {
              uVar9 = 1;
            }
            uVar8 = 0;
            do {
              uVar2 = *(ulong *)((long)local_48 + uVar8 * 8);
              *(ulong *)((long)local_48 + uVar8 * 8) =
                   uVar2 >> 0x38 | (uVar2 & 0xff000000000000) >> 0x28 |
                   (uVar2 & 0xff0000000000) >> 0x18 | (uVar2 & 0xff00000000) >> 8 |
                   (uVar2 & 0xff000000) << 8 | (uVar2 & 0xff0000) << 0x18 | (uVar2 & 0xff00) << 0x28
                   | uVar2 << 0x38;
              uVar8 = uVar8 + 1;
            } while (uVar9 != uVar8);
          }
          if (0 < (int)uVar5) {
            uVar9 = 1;
            if (1 < (int)local_50) {
              uVar9 = local_50 & 0xffffffff;
            }
            global = (REF_GLOB)iVar6;
            lVar14 = 0;
            do {
              uVar5 = ref_node_add(ref_node,global,&local_78);
              if (uVar5 != 0) {
                printf("%s: %d: %s: %d %s\n",
                       "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_import.c"
                       ,0x24a,"ref_import_bin_ugrid",(ulong)uVar5,"new_node");
                return uVar5;
              }
              pRVar3 = ref_node->real;
              lVar10 = (long)local_78;
              pRVar3[lVar10 * 0xf] = *(REF_DBL *)((long)local_48 + lVar14);
              pRVar3[lVar10 * 0xf + 1] = *(REF_DBL *)((long)local_48 + lVar14 + 8);
              pRVar3[lVar10 * 0xf + 2] = *(REF_DBL *)((long)local_48 + lVar14 + 0x10);
              lVar14 = lVar14 + 0x18;
              global = global + 1;
            } while (uVar9 * 0x18 != lVar14);
          }
          iVar6 = (int)local_50 + iVar6;
          __ptr = local_48;
          lVar14 = local_38;
        } while (iVar6 < (int)local_38);
      }
      free(__ptr);
      uVar5 = ref_node_initialize_n_global(ref_node,lVar14);
      if (uVar5 != 0) {
        printf("%s: %d: %s: %d %s\n",
               "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_import.c",
               0x253,"ref_import_bin_ugrid",(ulong)uVar5,"init glob");
        return uVar5;
      }
      if (0 < ref_mpi->timing) {
        ref_mpi_stopwatch_stop(ref_mpi,"ugrid node");
      }
      uVar5 = ref_import_bin_ugrid_c2n(pRVar1->cell[3],local_60,(FILE *)__stream,swap,fat);
      if (uVar5 != 0) {
        printf("%s: %d: %s: %d %s\n",
               "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_import.c",
               600,"ref_import_bin_ugrid",(ulong)uVar5,"tri face nodes");
        return uVar5;
      }
      uVar5 = ref_import_bin_ugrid_c2n(pRVar1->cell[6],local_64,(FILE *)__stream,swap,fat);
      if (uVar5 != 0) {
        printf("%s: %d: %s: %d %s\n",
               "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_import.c",
               0x25a,"ref_import_bin_ugrid",(ulong)uVar5,"qua face nodes");
        return uVar5;
      }
      uVar5 = ref_import_bin_ugrid_bound_tag(pRVar1->cell[3],local_60,(FILE *)__stream,swap,fat);
      if (uVar5 != 0) {
        printf("%s: %d: %s: %d %s\n",
               "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_import.c",
               0x25e,"ref_import_bin_ugrid",(ulong)uVar5,"tri face tags");
        return uVar5;
      }
      uVar5 = ref_import_bin_ugrid_bound_tag(pRVar1->cell[6],local_64,(FILE *)__stream,swap,fat);
      if (uVar5 != 0) {
        printf("%s: %d: %s: %d %s\n",
               "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_import.c",
               0x261,"ref_import_bin_ugrid",(ulong)uVar5,"tri face tags");
        return uVar5;
      }
      if (0 < ref_mpi->timing) {
        ref_mpi_stopwatch_stop(ref_mpi,"ugrid tri");
      }
      uVar5 = ref_import_bin_ugrid_c2n(pRVar1->cell[8],local_68,(FILE *)__stream,swap,fat);
      if (uVar5 == 0) {
        if (0 < ref_mpi->timing) {
          ref_mpi_stopwatch_stop(ref_mpi,"ugrid tet");
        }
        uVar5 = ref_import_bin_ugrid_c2n(pRVar1->cell[9],local_6c,(FILE *)__stream,swap,fat);
        if (uVar5 != 0) {
          printf("%s: %d: %s: %d %s\n",
                 "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_import.c",
                 0x268,"ref_import_bin_ugrid",(ulong)uVar5,"pyr face nodes");
          return uVar5;
        }
        if (0 < ref_mpi->timing) {
          ref_mpi_stopwatch_stop(ref_mpi,"ugrid pyr");
        }
        uVar5 = ref_import_bin_ugrid_c2n(pRVar1->cell[10],local_70,(FILE *)__stream,swap,fat);
        if (uVar5 == 0) {
          if (0 < ref_mpi->timing) {
            ref_mpi_stopwatch_stop(ref_mpi,"ugrid pri");
          }
          uVar5 = ref_import_bin_ugrid_c2n(pRVar1->cell[0xb],local_74,(FILE *)__stream,swap,fat);
          if (uVar5 == 0) {
            if (0 < ref_mpi->timing) {
              ref_mpi_stopwatch_stop(ref_mpi,"ugrid hex");
            }
            fclose(__stream);
            return 0;
          }
          printf("%s: %d: %s: %d %s\n",
                 "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_import.c",
                 0x26e,"ref_import_bin_ugrid",(ulong)uVar5,"hex face nodes");
          return uVar5;
        }
        printf("%s: %d: %s: %d %s\n",
               "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_import.c",
               0x26b,"ref_import_bin_ugrid",(ulong)uVar5,"pri face nodes");
        return uVar5;
      }
      printf("%s: %d: %s: %d %s\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_import.c",
             0x265,"ref_import_bin_ugrid",(ulong)uVar5,"tet face nodes");
      return uVar5;
    }
    pcVar12 = "malloc xyz of REF_DBL NULL";
    uVar11 = 0x241;
  }
  printf("%s: %d: %s: %s\n",
         "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_import.c",uVar11,
         "ref_import_bin_ugrid",pcVar12);
  return 2;
}

Assistant:

REF_FCN static REF_STATUS ref_import_bin_ugrid(REF_GRID *ref_grid_ptr,
                                               REF_MPI ref_mpi,
                                               const char *filename,
                                               REF_BOOL swap, REF_BOOL fat) {
  REF_GRID ref_grid;
  REF_NODE ref_node;
  FILE *file;
  REF_INT nnode, ntri, nqua, ntet, npyr, npri, nhex;

  REF_INT node, new_node;
  REF_INT max_chunk, nread, chunk, ixyz;
  REF_DBL *xyz;

  RSS(ref_grid_create(ref_grid_ptr, ref_mpi), "create grid");
  ref_grid = (*ref_grid_ptr);
  ref_node = ref_grid_node(ref_grid);

  file = fopen(filename, "r");
  if (NULL == (void *)file) printf("unable to open %s\n", filename);
  RNS(file, "unable to open file");

  RSS(ref_import_bin_ugrid_chunk(file, swap, fat, 1, &nnode), "nnode");
  RSS(ref_import_bin_ugrid_chunk(file, swap, fat, 1, &ntri), "ntri");
  RSS(ref_import_bin_ugrid_chunk(file, swap, fat, 1, &nqua), "nqua");
  RSS(ref_import_bin_ugrid_chunk(file, swap, fat, 1, &ntet), "ntet");
  RSS(ref_import_bin_ugrid_chunk(file, swap, fat, 1, &npyr), "npyr");
  RSS(ref_import_bin_ugrid_chunk(file, swap, fat, 1, &npri), "npri");
  RSS(ref_import_bin_ugrid_chunk(file, swap, fat, 1, &nhex), "nhex");
  if (0 < ref_mpi_timing(ref_mpi))
    ref_mpi_stopwatch_stop(ref_mpi, "ugrid header");

  /* large block reads recommended for IO performance */
  max_chunk = MIN(1000000, nnode);
  ref_malloc(xyz, 3 * max_chunk, REF_DBL);
  nread = 0;
  while (nread < nnode) {
    chunk = MIN(max_chunk, nnode - nread);
    REIS(3 * chunk, fread(xyz, sizeof(REF_DBL), (size_t)(3 * chunk), file),
         "xyz");
    if (swap)
      for (ixyz = 0; ixyz < 3 * chunk; ixyz++) SWAP_DBL(xyz[ixyz]);
    for (node = 0; node < chunk; node++) {
      RSS(ref_node_add(ref_node, node + nread, &new_node), "new_node");
      ref_node_xyz(ref_node, 0, new_node) = xyz[0 + 3 * node];
      ref_node_xyz(ref_node, 1, new_node) = xyz[1 + 3 * node];
      ref_node_xyz(ref_node, 2, new_node) = xyz[2 + 3 * node];
    }
    nread += chunk;
  }
  ref_free(xyz);

  RSS(ref_node_initialize_n_global(ref_node, nnode), "init glob");
  if (0 < ref_mpi_timing(ref_mpi))
    ref_mpi_stopwatch_stop(ref_mpi, "ugrid node");

  RSS(ref_import_bin_ugrid_c2n(ref_grid_tri(ref_grid), ntri, file, swap, fat),
      "tri face nodes");
  RSS(ref_import_bin_ugrid_c2n(ref_grid_qua(ref_grid), nqua, file, swap, fat),
      "qua face nodes");

  RSS(ref_import_bin_ugrid_bound_tag(ref_grid_tri(ref_grid), ntri, file, swap,
                                     fat),
      "tri face tags");
  RSS(ref_import_bin_ugrid_bound_tag(ref_grid_qua(ref_grid), nqua, file, swap,
                                     fat),
      "tri face tags");
  if (0 < ref_mpi_timing(ref_mpi)) ref_mpi_stopwatch_stop(ref_mpi, "ugrid tri");

  RSS(ref_import_bin_ugrid_c2n(ref_grid_tet(ref_grid), ntet, file, swap, fat),
      "tet face nodes");
  if (0 < ref_mpi_timing(ref_mpi)) ref_mpi_stopwatch_stop(ref_mpi, "ugrid tet");
  RSS(ref_import_bin_ugrid_c2n(ref_grid_pyr(ref_grid), npyr, file, swap, fat),
      "pyr face nodes");
  if (0 < ref_mpi_timing(ref_mpi)) ref_mpi_stopwatch_stop(ref_mpi, "ugrid pyr");
  RSS(ref_import_bin_ugrid_c2n(ref_grid_pri(ref_grid), npri, file, swap, fat),
      "pri face nodes");
  if (0 < ref_mpi_timing(ref_mpi)) ref_mpi_stopwatch_stop(ref_mpi, "ugrid pri");
  RSS(ref_import_bin_ugrid_c2n(ref_grid_hex(ref_grid), nhex, file, swap, fat),
      "hex face nodes");
  if (0 < ref_mpi_timing(ref_mpi)) ref_mpi_stopwatch_stop(ref_mpi, "ugrid hex");

  fclose(file);

  return REF_SUCCESS;
}